

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceMeanLayerParams::MergeFrom
          (ReduceMeanLayerParams *this,ReduceMeanLayerParams *from)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  ReduceMeanLayerParams *local_18;
  ReduceMeanLayerParams *from_local;
  ReduceMeanLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xc55b);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<long>::MergeFrom(&this->axes_,&local_18->axes_);
  bVar1 = _internal_keepdims(local_18);
  if (bVar1) {
    bVar1 = _internal_keepdims(local_18);
    _internal_set_keepdims(this,bVar1);
  }
  bVar1 = _internal_reduceall(local_18);
  if (bVar1) {
    bVar1 = _internal_reduceall(local_18);
    _internal_set_reduceall(this,bVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ReduceMeanLayerParams::MergeFrom(const ReduceMeanLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ReduceMeanLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  axes_.MergeFrom(from.axes_);
  if (from._internal_keepdims() != 0) {
    _internal_set_keepdims(from._internal_keepdims());
  }
  if (from._internal_reduceall() != 0) {
    _internal_set_reduceall(from._internal_reduceall());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}